

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr-sys-linux.c
# Opt level: O0

int open_msr(uint32_t core,int flags)

{
  FILE *__stream;
  int *piVar1;
  char *pcVar2;
  int local_3c;
  char local_38 [4];
  int fd;
  char msr_filename [32];
  int flags_local;
  uint32_t core_local;
  
  snprintf(local_38,0x20,"/dev/cpu/%u/msr_safe",(ulong)core);
  local_3c = open(local_38,flags);
  if (local_3c < 0) {
    snprintf(local_38,0x20,"/dev/cpu/%u/msr",(ulong)core);
    local_3c = open(local_38,flags);
    if (local_3c < 0) {
      fprintf(_stderr,"%s [%s] ","[ERROR]","raplcap-msr");
      __stream = _stderr;
      piVar1 = __errno_location();
      pcVar2 = strerror(*piVar1);
      fprintf(__stream,"%s: %s\n",local_38,pcVar2);
      piVar1 = __errno_location();
      if (*piVar1 == 2) {
        fprintf(_stderr,"%s [%s] ","[WARN] ","raplcap-msr");
        fprintf(_stderr,"Is the msr kernel module loaded?\n");
      }
    }
  }
  return local_3c;
}

Assistant:

static int open_msr(uint32_t core, int flags) {
  char msr_filename[32];
  int fd;
  // first try using the msr_safe kernel module
  snprintf(msr_filename, sizeof(msr_filename), "/dev/cpu/%"PRIu32"/msr_safe", core);
  if ((fd = open(msr_filename, flags)) < 0) {
    raplcap_perror(DEBUG, msr_filename);
    raplcap_log(INFO, "msr-safe not available, falling back on standard msr\n");
    // fall back on the standard msr kernel module
    snprintf(msr_filename, sizeof(msr_filename), "/dev/cpu/%"PRIu32"/msr", core);
    if ((fd = open(msr_filename, flags)) < 0) {
      raplcap_perror(ERROR, msr_filename);
      if (errno == ENOENT) {
        raplcap_log(WARN, "Is the msr kernel module loaded?\n");
      }
    }
  }
  return fd;
}